

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceComponentOfInterfaceVarWith
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          Instruction *interface_var_user,Instruction *scalar_var,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices,
          uint32_t *extra_array_index,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_component_values,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_for_access_chain_to_component_values)

{
  initializer_list<unsigned_int> init_list;
  Instruction *interface_var_00;
  uint32_t uVar1;
  IRContext *pIVar2;
  Instruction *pIVar3;
  pointer this_00;
  MessageConsumer *this_01;
  char *__args_3;
  spv_position_t local_178;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  string local_d8 [8];
  string message;
  SmallVector<unsigned_int,_2UL> local_a0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_78;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*> local_60;
  Instruction *local_50;
  Instruction *scalar_load;
  uint32_t value_id;
  Op opcode;
  uint32_t *extra_array_index_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices_local;
  Instruction *scalar_var_local;
  Instruction *interface_var_user_local;
  Instruction *interface_var_local;
  InterfaceVariableScalarReplacement *this_local;
  
  _value_id = extra_array_index;
  extra_array_index_local = (uint32_t *)interface_var_component_indices;
  interface_var_component_indices_local =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)scalar_var;
  scalar_var_local = interface_var_user;
  interface_var_user_local = interface_var;
  interface_var_local = (Instruction *)this;
  scalar_load._4_4_ = opt::Instruction::opcode(interface_var_user);
  interface_var_00 = interface_var_user_local;
  pIVar3 = scalar_var_local;
  if (scalar_load._4_4_ == OpStore) {
    scalar_load._0_4_ = opt::Instruction::GetSingleWordInOperand(scalar_var_local,1);
    StoreComponentOfValueToScalarVar
              (this,(uint32_t)scalar_load,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)extra_array_index_local,
               (Instruction *)interface_var_component_indices_local,_value_id,scalar_var_local);
    this_local._7_1_ = 1;
  }
  else if (scalar_load._4_4_ == OpLoad) {
    local_50 = LoadScalarVar(this,(Instruction *)interface_var_component_indices_local,_value_id,
                             scalar_var_local);
    std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>::
    pair<spvtools::opt::Instruction_*&,_spvtools::opt::Instruction_*&,_true>
              (&local_60,&scalar_var_local,&local_50);
    std::
    unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
    ::insert(loads_to_component_values,&local_60);
    this_local._7_1_ = 1;
  }
  else if ((_value_id == (uint32_t *)0x0) || (*_value_id == 0)) {
    if ((scalar_load._4_4_ == OpDecorateId) ||
       ((scalar_load._4_4_ == OpDecorateString || (scalar_load._4_4_ == OpDecorate)))) {
      uVar1 = opt::Instruction::result_id((Instruction *)interface_var_component_indices_local);
      CloneAnnotationForVariable(this,pIVar3,uVar1);
      this_local._7_1_ = 1;
    }
    else if (scalar_load._4_4_ == OpName) {
      pIVar2 = Pass::context(&this->super_Pass);
      pIVar3 = opt::Instruction::Clone(pIVar3,pIVar2);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_78,pIVar3);
      this_00 = std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::operator->(&local_78);
      message.field_2._12_4_ =
           opt::Instruction::result_id((Instruction *)interface_var_component_indices_local);
      init_list._M_len = 1;
      init_list._M_array = (iterator)((long)&message.field_2 + 0xc);
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list);
      opt::Instruction::SetInOperand(this_00,0,&local_a0);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
      pIVar2 = Pass::context(&this->super_Pass);
      IRContext::AddDebug2Inst(pIVar2,&local_78);
      this_local._7_1_ = 1;
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_78);
    }
    else if (scalar_load._4_4_ == OpEntryPoint) {
      uVar1 = opt::Instruction::result_id((Instruction *)interface_var_component_indices_local);
      this_local._7_1_ = ReplaceInterfaceVarInEntryPoint(this,interface_var_00,pIVar3,uVar1);
    }
    else if (scalar_load._4_4_ == OpAccessChain) {
      ReplaceAccessChainWith
                (this,scalar_var_local,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)extra_array_index_local,
                 (Instruction *)interface_var_component_indices_local,
                 loads_for_access_chain_to_component_values);
      this_local._7_1_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d8,"Unhandled instruction",&local_d9)
      ;
      std::allocator<char>::~allocator(&local_d9);
      opt::Instruction::PrettyPrint_abi_cxx11_(&local_120,scalar_var_local,0x40);
      std::operator+(&local_100,"\n  ",&local_120);
      std::__cxx11::string::operator+=(local_d8,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      opt::Instruction::PrettyPrint_abi_cxx11_(&local_160,interface_var_user_local,0x40);
      std::operator+(&local_140,"\nfor interface variable scalar replacement\n  ",&local_160);
      std::__cxx11::string::operator+=(local_d8,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      pIVar2 = Pass::context(&this->super_Pass);
      this_01 = IRContext::consumer(pIVar2);
      memset(&local_178,0,0x18);
      __args_3 = (char *)std::__cxx11::string::c_str();
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(this_01,SPV_MSG_ERROR,"",&local_178,__args_3);
      this_local._7_1_ = 0;
      std::__cxx11::string::~string(local_d8);
    }
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceComponentOfInterfaceVarWith(
    Instruction* interface_var, Instruction* interface_var_user,
    Instruction* scalar_var,
    const std::vector<uint32_t>& interface_var_component_indices,
    const uint32_t* extra_array_index,
    std::unordered_map<Instruction*, Instruction*>* loads_to_component_values,
    std::unordered_map<Instruction*, Instruction*>*
        loads_for_access_chain_to_component_values) {
  spv::Op opcode = interface_var_user->opcode();
  if (opcode == spv::Op::OpStore) {
    uint32_t value_id = interface_var_user->GetSingleWordInOperand(1);
    StoreComponentOfValueToScalarVar(value_id, interface_var_component_indices,
                                     scalar_var, extra_array_index,
                                     interface_var_user);
    return true;
  }
  if (opcode == spv::Op::OpLoad) {
    Instruction* scalar_load =
        LoadScalarVar(scalar_var, extra_array_index, interface_var_user);
    loads_to_component_values->insert({interface_var_user, scalar_load});
    return true;
  }

  // Copy OpName and annotation instructions only once. Therefore, we create
  // them only for the first element of the extra array.
  if (extra_array_index && *extra_array_index != 0) return true;

  if (opcode == spv::Op::OpDecorateId || opcode == spv::Op::OpDecorateString ||
      opcode == spv::Op::OpDecorate) {
    CloneAnnotationForVariable(interface_var_user, scalar_var->result_id());
    return true;
  }

  if (opcode == spv::Op::OpName) {
    std::unique_ptr<Instruction> new_inst(interface_var_user->Clone(context()));
    new_inst->SetInOperand(0, {scalar_var->result_id()});
    context()->AddDebug2Inst(std::move(new_inst));
    return true;
  }

  if (opcode == spv::Op::OpEntryPoint) {
    return ReplaceInterfaceVarInEntryPoint(interface_var, interface_var_user,
                                           scalar_var->result_id());
  }

  if (opcode == spv::Op::OpAccessChain) {
    ReplaceAccessChainWith(interface_var_user, interface_var_component_indices,
                           scalar_var,
                           loads_for_access_chain_to_component_values);
    return true;
  }

  std::string message("Unhandled instruction");
  message += "\n  " + interface_var_user->PrettyPrint(
                          SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  message +=
      "\nfor interface variable scalar replacement\n  " +
      interface_var->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
  return false;
}